

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O2

int gost_mac(gost_ctx *ctx,int mac_len,uchar *data,uint data_len,uchar *mac)

{
  uint uVar1;
  uint uVar2;
  byte buffer [8];
  byte buf2 [8];
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  uVar1 = 0;
  while( true ) {
    if (data_len < uVar1 + 8) break;
    mac_block(ctx,buffer,data + uVar1);
    uVar1 = uVar1 + 8;
  }
  uVar2 = uVar1;
  if (uVar1 <= data_len && data_len - uVar1 != 0) {
    uVar2 = uVar1 + 8;
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    memcpy(buf2,data + uVar1,(ulong)(data_len - uVar1));
    mac_block(ctx,buffer,buf2);
  }
  if (uVar2 == 8) {
    buf2[0] = '\0';
    buf2[1] = '\0';
    buf2[2] = '\0';
    buf2[3] = '\0';
    buf2[4] = '\0';
    buf2[5] = '\0';
    buf2[6] = '\0';
    buf2[7] = '\0';
    mac_block(ctx,buffer,buf2);
  }
  get_mac(buffer,mac_len,mac);
  return 1;
}

Assistant:

int gost_mac(gost_ctx * ctx, int mac_len, const unsigned char *data,
             unsigned int data_len, unsigned char *mac)
{
    byte buffer[8] = { 0, 0, 0, 0, 0, 0, 0, 0 };
    byte buf2[8];
    unsigned int i;
    for (i = 0; i + 8 <= data_len; i += 8)
        mac_block(ctx, buffer, data + i);
    if (i < data_len) {
        memset(buf2, 0, 8);
        memcpy(buf2, data + i, data_len - i);
        mac_block(ctx, buffer, buf2);
        i += 8;
    }
    if (i == 8) {
        memset(buf2, 0, 8);
        mac_block(ctx, buffer, buf2);
    }
    get_mac(buffer, mac_len, mac);
    return 1;
}